

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O2

void randinit(uint seed)

{
  __pid_t _Var1;
  clock_t cVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  timeval now;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  initstate(seed,seedState,0x100);
  cVar2 = clock();
  _Var1 = getpid();
  uVar3 = (ulong)_Var1;
  uVar4 = uVar3 >> 0xd ^ (local_20.tv_usec - cVar2) - uVar3;
  uVar5 = uVar4 << 8 ^ (cVar2 - uVar4) - uVar3;
  uVar6 = uVar5 >> 0xd ^ (uVar3 - uVar4) - uVar5;
  uVar3 = uVar6 >> 0xc ^ (uVar4 - uVar5) - uVar6;
  uVar4 = uVar3 << 0x10 ^ (uVar5 - uVar6) - uVar3;
  uVar5 = uVar4 >> 5 ^ (uVar6 - uVar3) - uVar4;
  uVar3 = uVar5 >> 3 ^ (uVar3 - uVar4) - uVar5;
  uVar4 = uVar3 << 10 ^ (uVar4 - uVar5) - uVar3;
  initstate((uint)(uVar4 >> 0xf) ^ (int)uVar5 - ((int)uVar3 + (int)uVar4),unseededState,0x100);
  return;
}

Assistant:

void randinit(unsigned int seed)
{
	struct timeval 		now;
	gettimeofday(&now, 0);

	initstate(seed, seedState, 256);
	initstate(mix(now.tv_usec, clock(), getpid()), unseededState, 256);
}